

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O3

vector<TCacheReq,_std::allocator<TCacheReq>_> *
PriorityQueueAssignment
          (vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  mapped_type mVar1;
  pointer pTVar2;
  ulong uVar3;
  iterator __position;
  double dVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  pointer puVar7;
  const_iterator cVar8;
  ulong uVar9;
  iterator iVar10;
  pointer pTVar11;
  pointer puVar12;
  TCacheConn *cacheConn;
  pointer ppVar13;
  pointer pTVar14;
  pointer pTVar15;
  pointer ppVar16;
  __buckets_ptr pp_Var17;
  TRequest *request;
  _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var18;
  bool bVar19;
  TCacheReq cacheRequest_1;
  TCacheReq cacheRequest;
  unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
  serveTime;
  unordered_set<TCacheReq,_std::hash<TCacheReq>,_std::equal_to<TCacheReq>,_std::allocator<TCacheReq>_>
  addedCacheRequests;
  TCacheReq local_128;
  value_type local_118;
  priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_discobot[P]hashcode_practice_run_cpp:216:16)>
  local_f8;
  vector<TCacheReq,std::allocator<TCacheReq>> *local_d8;
  _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_d0;
  key_type local_c8;
  key_type local_b0;
  _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pTVar11 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar15 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_d8 = (vector<TCacheReq,std::allocator<TCacheReq>> *)__return_storage_ptr__;
  if (pTVar15 != pTVar11) {
    puVar7 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar12 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppVar16 = (pointer)0x0;
    do {
      bVar19 = puVar12 != puVar7;
      puVar12 = puVar7;
      if (bVar19) {
        ppVar13 = (pointer)0x0;
        do {
          mVar1 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)ppVar16].Latency;
          local_f8.c.
          super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = ppVar16;
          local_f8.c.
          super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar13;
          pmVar6 = std::__detail::
                   _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_a0,(key_type *)&local_f8);
          *pmVar6 = mVar1;
          ppVar13 = (pointer)((long)&(ppVar13->first).ServerId + 1);
          puVar7 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar12 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar13 < (pointer)((long)puVar12 - (long)puVar7 >> 3));
        pTVar11 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar15 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppVar16 = (pointer)((long)&(ppVar16->first).ServerId + 1);
    } while (ppVar16 < (pointer)((long)pTVar15 - (long)pTVar11 >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Serve times initialized\n",0x18);
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.c.
  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var18 = (_Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(p->Requests).super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_d0 = (_Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(p->Requests).super__Vector_base<TRequest,_std::allocator<TRequest>_>._M_impl.
                super__Vector_impl_data._M_finish;
  if (p_Var18 != local_d0) {
    do {
      pTVar11 = (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 = *(pointer *)
                ((long)&pTVar11[p_Var18->_M_bucket_count].Caches.
                        super__Vector_base<TCacheConn,_std::allocator<TCacheConn>_>._M_impl + 8);
      for (pTVar14 = *(pointer *)
                      &pTVar11[p_Var18->_M_bucket_count].Caches.
                       super__Vector_base<TCacheConn,_std::allocator<TCacheConn>_>._M_impl;
          pTVar14 != pTVar2; pTVar14 = pTVar14 + 1) {
        local_c8.ServerId = pTVar14->ServerId;
        local_c8.VideoId = (size_t)p_Var18->_M_buckets;
        cVar8 = std::
                _Hashtable<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&local_68,&local_c8);
        if (cVar8.super__Node_iterator_base<TCacheReq,_false>._M_cur == (__node_type *)0x0) {
          local_118.first.ServerId = (size_t)&local_68;
          std::
          _Hashtable<TCacheReq,TCacheReq,std::allocator<TCacheReq>,std::__detail::_Identity,std::equal_to<TCacheReq>,std::hash<TCacheReq>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<TCacheReq_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<TCacheReq,false>>>>
                    ((_Hashtable<TCacheReq,TCacheReq,std::allocator<TCacheReq>,std::__detail::_Identity,std::equal_to<TCacheReq>,std::hash<TCacheReq>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_68,&local_c8,&local_118);
          dVar4 = CalcPriority(p,(unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                                  *)&local_a0,&local_c8);
          local_118.first.ServerId = local_c8.ServerId;
          local_118.first.VideoId = local_c8.VideoId;
          local_118.second =
               (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
          std::
          priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
          ::push(&local_f8,&local_118);
        }
      }
      p_Var18 = (_Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&p_Var18->_M_element_count;
    } while (p_Var18 != local_d0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Starting\n",9);
  std::ostream::flush();
  if (local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_d0 = &(p->Latencies)._M_h;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\rQueue size: ",0xd)
      ;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ostream::flush();
      local_c8.ServerId =
           ((local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first).ServerId;
      local_c8.VideoId =
           ((local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first).VideoId;
      uVar3 = (local_f8.c.
               super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
      if (0x18 < (long)local_f8.c.
                       super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.c.
                       super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
        local_118.second =
             local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].second;
        local_118.first.ServerId =
             local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].first.ServerId;
        local_118.first.VideoId =
             local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].first.VideoId;
        sVar5 = ((local_f8.c.
                  super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first).VideoId;
        local_f8.c.
        super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first.ServerId =
             ((local_f8.c.
               super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first).ServerId;
        local_f8.c.
        super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].first.VideoId = sVar5;
        local_f8.c.
        super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].second =
             (local_f8.c.
              super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second;
        std::
        __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<TCacheReq,unsigned_long>*,std::vector<std::pair<TCacheReq,unsigned_long>,std::allocator<std::pair<TCacheReq,unsigned_long>>>>,long,std::pair<TCacheReq,unsigned_long>,__gnu_cxx::__ops::_Iter_comp_iter<PriorityQueueAssignment(TProblem&)::__0>>
                  (local_f8.c.
                   super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,0,
                   ((long)local_f8.c.
                          super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                    (-0x18 - (long)local_f8.c.
                                   super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x5555555555555555);
      }
      local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_f8.c.
           super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_128.ServerId = local_c8.ServerId;
      local_128.VideoId = local_c8.VideoId;
      if ((p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[local_c8.VideoId] <=
          (p->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[local_c8.ServerId]) {
        dVar4 = CalcPriority(p,(unordered_map<TEndpointVideo,_unsigned_long,_std::hash<TEndpointVideo>,_std::equal_to<TEndpointVideo>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>_>
                                *)&local_a0,&local_128);
        uVar9 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
        if (uVar3 == uVar9) {
          if ((p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_128.VideoId] <=
              (p->Capacities).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[local_128.ServerId]) {
            __position._M_current = *(TCacheReq **)(local_d8 + 8);
            if (__position._M_current == *(TCacheReq **)(local_d8 + 0x10)) {
              std::vector<TCacheReq,std::allocator<TCacheReq>>::_M_realloc_insert<TCacheReq_const&>
                        (local_d8,__position,&local_128);
            }
            else {
              (__position._M_current)->ServerId = local_128.ServerId;
              (__position._M_current)->VideoId = local_128.VideoId;
              *(long *)(local_d8 + 8) = *(long *)(local_d8 + 8) + 0x10;
            }
            puVar12 = (p->Capacities).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + local_128.ServerId;
            *puVar12 = *puVar12 -
                       (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[local_128.VideoId];
            if ((p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (p->Endpoints).super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pp_Var17 = (__buckets_ptr)0x0;
              do {
                local_118.first.VideoId = local_128.ServerId;
                local_118.first.ServerId = (size_t)pp_Var17;
                iVar10 = std::
                         _Hashtable<TEndpointCache,_std::pair<const_TEndpointCache,_unsigned_long>,_std::allocator<std::pair<const_TEndpointCache,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointCache>,_std::hash<TEndpointCache>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(local_d0,(key_type *)&local_118);
                if (iVar10.
                    super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                    ._M_cur != (__node_type *)0x0) {
                  local_118.first.VideoId = local_128.VideoId;
                  local_118.first.ServerId = (size_t)pp_Var17;
                  pmVar6 = std::__detail::
                           _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&local_a0,(key_type *)&local_118);
                  uVar3 = *(ulong *)((long)iVar10.
                                           super__Node_iterator_base<std::pair<const_TEndpointCache,_unsigned_long>,_false>
                                           ._M_cur + 0x18);
                  uVar9 = *pmVar6;
                  local_b0.VideoId = local_128.VideoId;
                  local_b0.EndpointId = (size_t)pp_Var17;
                  pmVar6 = std::__detail::
                           _Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&local_a0,&local_b0);
                  if (uVar3 < uVar9) {
                    uVar9 = uVar3;
                  }
                  *pmVar6 = uVar9;
                }
                pp_Var17 = (__buckets_ptr)((long)pp_Var17 + 1);
              } while (pp_Var17 <
                       (__buckets_ptr)
                       ((long)(p->Endpoints).
                              super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(p->Endpoints).
                              super__Vector_base<TEndpoint,_std::allocator<TEndpoint>_>._M_impl.
                              super__Vector_impl_data._M_start >> 5));
            }
          }
        }
        else {
          local_118.first.ServerId = local_128.ServerId;
          local_118.first.VideoId = local_128.VideoId;
          local_118.second = uVar9;
          std::
          priority_queue<std::pair<TCacheReq,_unsigned_long>,_std::vector<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/discobot[P]hashcode-practice/run.cpp:216:16)>
          ::push(&local_f8,&local_118);
        }
      }
    } while (local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_f8.c.
             super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  if (local_f8.c.
      super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.c.
                    super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.c.
                          super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.c.
                          super__Vector_base<std::pair<TCacheReq,_unsigned_long>,_std::allocator<std::pair<TCacheReq,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<TCacheReq,_TCacheReq,_std::allocator<TCacheReq>,_std::__detail::_Identity,_std::equal_to<TCacheReq>,_std::hash<TCacheReq>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<TEndpointVideo,_std::pair<const_TEndpointVideo,_unsigned_long>,_std::allocator<std::pair<const_TEndpointVideo,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<TEndpointVideo>,_std::hash<TEndpointVideo>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  return (vector<TCacheReq,_std::allocator<TCacheReq>_> *)local_d8;
}

Assistant:

std::vector<TCacheReq> PriorityQueueAssignment(TProblem& p) {
    std::vector<TCacheReq> result;
    std::unordered_map<TEndpointVideo, size_t> serveTime;
    std::unordered_set<TCacheReq> addedCacheRequests;
    for (size_t e = 0; e < p.Endpoints.size(); ++e) {
        for (size_t v = 0; v < p.Vides.size(); ++v) {
            serveTime[{e, v}] = p.Endpoints[e].Latency;
        }
    }
    std::cerr << "Serve times initialized\n";
    auto cmp = [&](auto& lhs, auto& rhs) { return lhs.second < rhs.second; };
    std::priority_queue<QueueEntry, std::vector<QueueEntry>, decltype(cmp)> queue(cmp);
    for (auto& request : p.Requests) {
        for (auto& cacheConn : p.Endpoints[request.EndpointId].Caches) {
            TCacheReq cacheRequest{cacheConn.ServerId, request.VideoId};
            if (addedCacheRequests.count(cacheRequest)) {
                continue;
            }
            addedCacheRequests.insert(cacheRequest);
            queue.push({cacheRequest, CalcPriority(p, serveTime, cacheRequest)});
        }
    }
    std::cerr << "Starting\n" << std::flush;
    while (!queue.empty()) {
        std::cerr << "\rQueue size: " << queue.size() << std::flush;
        auto entry = queue.top();
        queue.pop();
        auto cacheRequest = entry.first;
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        size_t priority = entry.second;
        size_t newPriority = CalcPriority(p, serveTime, cacheRequest);
        if (entry.second != newPriority) {
            queue.push({cacheRequest, newPriority});
            continue;
        }
        if (p.Capacities[cacheRequest.ServerId] < p.Vides[cacheRequest.VideoId]) {
            continue;
        }
        result.push_back(cacheRequest);
        p.Capacities[cacheRequest.ServerId] -= p.Vides[cacheRequest.VideoId];
        for (size_t e = 0; e < p.Endpoints.size(); ++e) {
            auto foundLatency = p.Latencies.find({e, cacheRequest.ServerId});
            if (foundLatency == p.Latencies.end()) {
                continue;
            }
            serveTime[{e, cacheRequest.VideoId}] =
                std::min(serveTime[{e, cacheRequest.VideoId}], foundLatency->second);
        }
    }
    std::cerr << "\n";
    return result;
}